

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

void cmsys::SystemTools::ReplaceString(string *source,char *replace,char *with)

{
  size_t replaceSize;
  char *local_78;
  allocator local_41;
  string local_40;
  char *local_20;
  char *with_local;
  char *replace_local;
  string *source_local;
  
  if (*replace != '\0') {
    local_20 = with;
    with_local = replace;
    replace_local = (char *)source;
    replaceSize = strlen(replace);
    if (local_20 == (char *)0x0) {
      local_78 = "";
    }
    else {
      local_78 = local_20;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,local_78,&local_41);
    ReplaceString(source,replace,replaceSize,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return;
}

Assistant:

void SystemTools::ReplaceString(std::string& source,
                                const char* replace,
                                const char* with)
{
  // do while hangs if replaceSize is 0
  if (!*replace)
    {
    return;
    }

  SystemTools::ReplaceString(source, replace, strlen(replace), with ? with : "");
}